

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.h
# Opt level: O2

bool __thiscall bsplib::A2A::recv_pop(A2A *this,int src_pid,size_t size)

{
  pointer puVar1;
  unsigned_long uVar2;
  ulong uVar3;
  
  puVar1 = (this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar2 = puVar1[src_pid];
  uVar3 = (this->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start[src_pid] - uVar2;
  if (size <= uVar3) {
    puVar1[src_pid] = uVar2 + size;
  }
  return size <= uVar3;
}

Assistant:

bool recv_pop( int src_pid, std::size_t size ){
        std::size_t o = m_recv_pos[src_pid];
        if ( m_recv_sizes[src_pid] - o  >= size ) {
            m_recv_pos[src_pid] += size;
            return true;
        }
        else {
            return false;
        }
    }